

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)12>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc)

{
  xml_attribute_struct *a;
  xml_node parent;
  xml_node local_30;
  
  if (xn[1] == 0) {
    local_30._root = (xml_node_struct *)*xn;
  }
  else {
    xml_node::xml_node(&local_30);
  }
  if (local_30._root == (xml_node_struct *)0x0) {
    if ((xn[1] != 0) && (*xn != 0)) {
      a = (xml_attribute_struct *)xn[1];
      if (a == (xml_attribute_struct *)0x0) {
        if (*xn == 0) {
          xml_node::xml_node(&local_30);
          parent._root = local_30._root;
        }
        else {
          xml_node::xml_node(&local_30,*(xml_node_struct **)(*xn + 0x18));
          parent._root = local_30._root;
        }
      }
      else {
        parent._root = (xml_node_struct *)*xn;
      }
      if (this->_test == '\x02') {
        step_push(this,ns,a,parent._root,alloc);
      }
    }
  }
  else {
    if (xn[1] == 0) {
      local_30._root = (xml_node_struct *)*xn;
    }
    else {
      xml_node::xml_node(&local_30);
    }
    step_push(this,ns,local_30._root,alloc);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}